

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_buffer_encoder.c
# Opt level: O0

lzma_ret block_encode_normal(lzma_block *block,lzma_allocator *allocator,uint8_t *in,size_t in_size,
                            uint8_t *out,size_t *out_pos,size_t out_size)

{
  undefined8 local_a8;
  size_t in_pos;
  undefined1 auStack_98 [4];
  lzma_ret ret;
  lzma_next_coder raw_encoder;
  size_t out_start;
  lzma_ret ret_;
  size_t *out_pos_local;
  uint8_t *out_local;
  size_t in_size_local;
  uint8_t *in_local;
  lzma_allocator *allocator_local;
  lzma_block *block_local;
  
  block_local._4_4_ = lzma_block_header_size(block);
  if (block_local._4_4_ == LZMA_OK) {
    if ((ulong)block->header_size < out_size - *out_pos) {
      raw_encoder.update =
           (_func_lzma_ret_void_ptr_lzma_allocator_ptr_lzma_filter_ptr_lzma_filter_ptr *)*out_pos;
      *out_pos = (ulong)block->header_size + *out_pos;
      if (block->compressed_size < out_size - *out_pos) {
        out_size = *out_pos + block->compressed_size;
      }
      memset(auStack_98,0,0x48);
      raw_encoder.coder = (void *)0xffffffffffffffff;
      in_pos._4_4_ = lzma_raw_encoder_init((lzma_next_coder *)auStack_98,allocator,block->filters);
      if (in_pos._4_4_ == LZMA_OK) {
        local_a8 = 0;
        in_pos._4_4_ = (*(code *)raw_encoder.init)
                                 (_auStack_98,allocator,in,&local_a8,in_size,out,out_pos,out_size,3)
        ;
      }
      lzma_next_end((lzma_next_coder *)auStack_98,allocator);
      if (in_pos._4_4_ == LZMA_STREAM_END) {
        block->compressed_size = *out_pos - (long)(raw_encoder.update + block->header_size);
        in_pos._4_4_ = lzma_block_header_encode(block,out + (long)raw_encoder.update);
        if (in_pos._4_4_ != LZMA_OK) {
          in_pos._4_4_ = LZMA_PROG_ERROR;
        }
      }
      else if (in_pos._4_4_ == LZMA_OK) {
        in_pos._4_4_ = LZMA_BUF_ERROR;
      }
      if (in_pos._4_4_ != LZMA_OK) {
        *out_pos = (size_t)raw_encoder.update;
      }
      block_local._4_4_ = in_pos._4_4_;
    }
    else {
      block_local._4_4_ = LZMA_BUF_ERROR;
    }
  }
  return block_local._4_4_;
}

Assistant:

static lzma_ret
block_encode_normal(lzma_block *block, const lzma_allocator *allocator,
		const uint8_t *in, size_t in_size,
		uint8_t *out, size_t *out_pos, size_t out_size)
{
	// Find out the size of the Block Header.
	return_if_error(lzma_block_header_size(block));

	// Reserve space for the Block Header and skip it for now.
	if (out_size - *out_pos <= block->header_size)
		return LZMA_BUF_ERROR;

	const size_t out_start = *out_pos;
	*out_pos += block->header_size;

	// Limit out_size so that we stop encoding if the output would grow
	// bigger than what uncompressed Block would be.
	if (out_size - *out_pos > block->compressed_size)
		out_size = *out_pos + block->compressed_size;

	// TODO: In many common cases this could be optimized to use
	// significantly less memory.
	lzma_next_coder raw_encoder = LZMA_NEXT_CODER_INIT;
	lzma_ret ret = lzma_raw_encoder_init(
			&raw_encoder, allocator, block->filters);

	if (ret == LZMA_OK) {
		size_t in_pos = 0;
		ret = raw_encoder.code(raw_encoder.coder, allocator,
				in, &in_pos, in_size, out, out_pos, out_size,
				LZMA_FINISH);
	}

	// NOTE: This needs to be run even if lzma_raw_encoder_init() failed.
	lzma_next_end(&raw_encoder, allocator);

	if (ret == LZMA_STREAM_END) {
		// Compression was successful. Write the Block Header.
		block->compressed_size
				= *out_pos - (out_start + block->header_size);
		ret = lzma_block_header_encode(block, out + out_start);
		if (ret != LZMA_OK)
			ret = LZMA_PROG_ERROR;

	} else if (ret == LZMA_OK) {
		// Output buffer became full.
		ret = LZMA_BUF_ERROR;
	}

	// Reset *out_pos if something went wrong.
	if (ret != LZMA_OK)
		*out_pos = out_start;

	return ret;
}